

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O1

void __thiscall Assimp::ASE::Parser::ParseLV3RotAnimationBlock(Parser *this,Animation *anim)

{
  pointer *ppaVar1;
  byte bVar2;
  char *pcVar3;
  iterator __position;
  pointer paVar4;
  byte *pbVar5;
  bool bVar6;
  float fVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  char *pcVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  ai_real f;
  uint iIndex;
  aiVector3D v;
  float local_78;
  uint local_74;
  aiQuatKey local_70;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  vector<aiQuatKey,_std::allocator<aiQuatKey>_> *local_38;
  
  local_38 = &anim->akeyRotations;
  iVar10 = 0;
  do {
    pcVar3 = this->filePtr;
    if (*pcVar3 == '*') {
      this->filePtr = pcVar3 + 1;
      iVar8 = strncmp("CONTROL_ROT_SAMPLE",pcVar3 + 1,0x12);
      if (iVar8 == 0) {
        bVar2 = pcVar3[0x13];
        bVar6 = false;
        if (((ulong)bVar2 < 0x21) && ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
          pcVar11 = pcVar3 + 0x14;
          if (bVar2 == 0) {
            pcVar11 = pcVar3 + 0x13;
          }
          this->filePtr = pcVar11;
          bVar6 = true;
        }
      }
      else {
        bVar6 = false;
      }
      if (bVar6) {
        anim->mRotationType = TRACK;
      }
      pcVar3 = this->filePtr;
      iVar8 = strncmp("CONTROL_BEZIER_ROT_KEY",pcVar3,0x16);
      if (iVar8 == 0) {
        bVar2 = pcVar3[0x16];
        if (((ulong)bVar2 < 0x21) && ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
          pcVar11 = pcVar3 + 0x17;
          if (bVar2 == 0) {
            pcVar11 = pcVar3 + 0x16;
          }
          this->filePtr = pcVar11;
          anim->mRotationType = BEZIER;
          bVar6 = true;
        }
      }
      pcVar3 = this->filePtr;
      iVar8 = strncmp("CONTROL_TCB_ROT_KEY",pcVar3,0x13);
      if (iVar8 == 0) {
        bVar2 = pcVar3[0x13];
        if ((0x20 < (ulong)bVar2) || ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) == 0))
        goto LAB_0040606f;
        pcVar11 = pcVar3 + 0x14;
        if (bVar2 == 0) {
          pcVar11 = pcVar3 + 0x13;
        }
        this->filePtr = pcVar11;
        anim->mRotationType = TCB;
      }
      else {
LAB_0040606f:
        if (!bVar6) goto LAB_00406241;
      }
      local_70.mTime = 0.0;
      local_70.mValue.w = 1.0;
      local_70.mValue.x = 0.0;
      local_70.mValue.y = 0.0;
      local_70.mValue.z = 0.0;
      __position._M_current =
           (anim->akeyRotations).super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (anim->akeyRotations).super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>::_M_realloc_insert<aiQuatKey>
                  (local_38,__position,&local_70);
      }
      else {
        ((__position._M_current)->mValue).y = 0.0;
        ((__position._M_current)->mValue).z = 0.0;
        (__position._M_current)->mTime = 0.0;
        ((__position._M_current)->mValue).w = 1.0;
        ((__position._M_current)->mValue).x = 0.0;
        ppaVar1 = &(anim->akeyRotations).super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppaVar1 = *ppaVar1 + 1;
      }
      paVar4 = (anim->akeyRotations).super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      local_70.mTime = 0.0;
      local_70.mValue._0_8_ = local_70.mValue._0_8_ & 0xffffffff00000000;
      ParseLV4MeshFloatTriple(this,(ai_real *)&local_70,&local_74);
      ParseLV4MeshFloat(this,&local_78);
      fVar14 = local_78;
      paVar4[-1].mTime = (double)local_74;
      local_48._0_4_ = SUB84(local_70.mTime,0);
      local_58 = (float)((ulong)local_70.mTime >> 0x20);
      uStack_40._0_4_ = 0;
      uStack_40._4_4_ = 0;
      fVar7 = local_70.mValue.w;
      fVar12 = local_70.mValue.w * local_70.mValue.w +
               (float)local_48 * (float)local_48 + local_58 * local_58;
      fStack_54 = local_58;
      fStack_50 = local_58;
      fStack_4c = local_58;
      if (fVar12 < 0.0) {
        local_48 = local_70.mTime;
        uStack_40 = 0;
        fVar12 = sqrtf(fVar12);
      }
      else {
        fVar12 = SQRT(fVar12);
        local_48._4_4_ = local_58;
      }
      fVar12 = 1.0 / fVar12;
      local_48 = (double)CONCAT44(local_48._4_4_,(float)local_48 * fVar12);
      local_58 = local_58 * fVar12;
      fVar13 = sinf(fVar14 * 0.5);
      fVar14 = cosf(fVar14 * 0.5);
      paVar4[-1].mValue.w = fVar14;
      paVar4[-1].mValue.x = (float)local_48 * fVar13;
      paVar4[-1].mValue.y = local_58 * fVar13;
      paVar4[-1].mValue.z = fVar7 * fVar12 * fVar13;
    }
LAB_00406241:
    pbVar5 = (byte *)this->filePtr;
    bVar2 = *pbVar5;
    uVar9 = (uint)bVar2;
    if (bVar2 == 0x7b) {
      iVar10 = iVar10 + 1;
    }
    else if (bVar2 == 0x7d) {
      iVar10 = iVar10 + -1;
      if (iVar10 == 0) {
        this->filePtr = (char *)(pbVar5 + 1);
        SkipToNextToken(this);
        return;
      }
    }
    else if (uVar9 == 0) {
      LogError(this,"Encountered unexpected EOL while parsing a *CONTROL_ROT_TRACK chunk (Level 3)")
      ;
    }
    if (((uVar9 < 0xe) && ((0x3401U >> (uVar9 & 0x1f) & 1) != 0)) &&
       (this->bLastWasEndLine == false)) {
      this->iLineNumber = this->iLineNumber + 1;
      this->bLastWasEndLine = true;
    }
    else {
      this->bLastWasEndLine = false;
    }
    this->filePtr = (char *)(pbVar5 + 1);
  } while( true );
}

Assistant:

void Parser::ParseLV3RotAnimationBlock(ASE::Animation& anim)
{
    AI_ASE_PARSER_INIT();
    unsigned int iIndex;
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;

            bool b = false;

            // For the moment we're just reading the  floats -
            // we ignore the additional information for bezier's and TCBs

            // simple scaling keyframe
            if (TokenMatch(filePtr,"CONTROL_ROT_SAMPLE" ,18))
            {
                b = true;
                anim.mRotationType = ASE::Animation::TRACK;
            }

            // Bezier scaling keyframe
            if (TokenMatch(filePtr,"CONTROL_BEZIER_ROT_KEY" ,22))
            {
                b = true;
                anim.mRotationType = ASE::Animation::BEZIER;
            }
            // TCB scaling keyframe
            if (TokenMatch(filePtr,"CONTROL_TCB_ROT_KEY" ,19))
            {
                b = true;
                anim.mRotationType = ASE::Animation::TCB;
            }
            if (b)
            {
                anim.akeyRotations.push_back(aiQuatKey());
                aiQuatKey& key = anim.akeyRotations.back();
                aiVector3D v;ai_real f;
                ParseLV4MeshFloatTriple(&v.x,iIndex);
                ParseLV4MeshFloat(f);
                key.mTime = (double)iIndex;
                key.mValue = aiQuaternion(v,f);
            }
        }
        AI_ASE_HANDLE_SECTION("3","*CONTROL_ROT_TRACK");
    }
}